

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

double __thiscall nnad::Matrix<double>::GetElement(Matrix<double> *this,int *i,int *j)

{
  int iVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  if ((*i < 0) || (this->_Lines < *i)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GetElement: line index out of range.",&local_39);
    Error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  iVar1 = *j;
  iVar2 = this->_Columns;
  if (iVar2 < iVar1 || iVar1 < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GetElement: column index out of range.",&local_39);
    Error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    iVar2 = this->_Columns;
    iVar1 = *j;
  }
  return (this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iVar2 * *i + iVar1];
}

Assistant:

T GetElement(int const& i, int const& j) const
    {
      if (i < 0 || i > _Lines)
        Error("GetElement: line index out of range.");

      if (j < 0 || j > _Columns)
        Error("GetElement: column index out of range.");

      return _Matrix[i * _Columns + j];
    }